

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall
wabt::WastParser::ParseModuleCommand(WastParser *this,Script *script,CommandPtr *out_command)

{
  undefined1 uVar2;
  undefined1 uVar3;
  ScriptModuleType SVar1;
  undefined1 uVar4;
  Command *pCVar5;
  WastParseOptions *pWVar6;
  pointer data;
  long *plVar7;
  pointer puVar8;
  pointer puVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined1 uVar16;
  undefined1 uVar18;
  undefined8 uVar19;
  string_view filename;
  pointer pEVar20;
  size_t sVar21;
  Result RVar22;
  TextScriptModule *pTVar23;
  DataScriptModule<(wabt::ScriptModuleType)1> *pDVar24;
  unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> uVar25;
  Enum EVar26;
  Module *this_00;
  Error *error;
  pointer pEVar27;
  pointer pEVar28;
  _Head_base<0UL,_wabt::ScriptModule_*,_false> base;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  ulong uStack_b8;
  unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> m;
  Errors errors_1;
  _Head_base<0UL,_wabt::ScriptModule_*,_false> local_68;
  unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_> lexer;
  Errors errors;
  undefined3 uVar15;
  undefined2 uVar17;
  
  local_68._M_head_impl = (ScriptModule *)0x0;
  RVar22 = ParseScriptModule(this,(unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>
                                   *)&local_68);
  base._M_head_impl = local_68._M_head_impl;
  if (RVar22.enum_ == Error) {
    EVar26 = Error;
  }
  else {
    SVar1 = (local_68._M_head_impl)->type_;
    if (SVar1 == Quoted) {
      std::make_unique<wabt::ModuleCommand>();
      pEVar27 = errors_1.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
                super__Vector_impl_data._M_start;
      cast<wabt::DataScriptModule<(wabt::ScriptModuleType)2>,wabt::ScriptModule>(base._M_head_impl);
      errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      m._M_t.super___uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>._M_t.
      super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
      super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl =
           (__uniq_ptr_data<wabt::Module,_std::default_delete<wabt::Module>,_true,_true>)
           (__uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>)0x0;
      errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = 0;
      errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ = 0;
      filename._M_str = (char *)0x0;
      filename._M_len = uStack_b8;
      WastLexer::CreateBufferLexer
                (filename,(void *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                 (Errors *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      RVar22 = ParseWatModule((WastLexer *)
                              lexer._M_t.
                              super___uniq_ptr_impl<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wabt::WastLexer_*,_std::default_delete<wabt::WastLexer>_>
                              .super__Head_base<0UL,_wabt::WastLexer_*,_false>._M_head_impl,&m,
                              &errors,this->options_);
      pEVar20 = (pointer)CONCAT44(errors.
                                  super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>.
                                  _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                  errors.
                                  super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>.
                                  _M_impl.super__Vector_impl_data._M_finish._0_4_);
      for (pEVar28 = errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
                     super__Vector_impl_data._M_start; pEVar28 != pEVar20; pEVar28 = pEVar28 + 1) {
        if ((pEVar28->loc).field_1.field_1.offset == 0xffffffffffffffff) {
          Error(this,0x1e07b9,(pEVar28->message)._M_dataplus._M_p);
        }
        else {
          Error(this,0x1e07d4);
        }
      }
      this_00 = (Module *)&(pEVar27->loc).filename._M_str;
      if (RVar22.enum_ == Ok) {
        Module::operator=(this_00,(Module *)
                                  m._M_t.
                                  super___uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>
                                  .super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl);
      }
      pEVar20 = errors_1.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
                super__Vector_impl_data._M_start;
      errors_1.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      pCVar5 = (out_command->_M_t).
               super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
               super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
               super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl;
      (out_command->_M_t).super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
      _M_t.super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
      super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl = (Command *)pEVar20;
      if (pCVar5 != (Command *)0x0) {
        (*pCVar5->_vptr_Command[1])();
      }
      std::unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>::~unique_ptr(&lexer);
      std::unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_>::~unique_ptr(&m);
      std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector(&errors);
      if (errors_1.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)errors_1.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>
                              ._M_impl.super__Vector_impl_data._M_start + 8))();
      }
    }
    else if (SVar1 == Binary) {
      std::make_unique<wabt::ScriptModuleCommand>();
      uVar25 = m;
      this_00 = (Module *)
                ((long)m._M_t.
                       super___uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>._M_t.
                       super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
                       super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x10);
      pDVar24 = cast<wabt::DataScriptModule<(wabt::ScriptModuleType)1>,wabt::ScriptModule>
                          (base._M_head_impl);
      ReadBinaryOptions::ReadBinaryOptions((ReadBinaryOptions *)&errors);
      pWVar6 = this->options_;
      uVar2 = (pWVar6->features).extended_const_enabled_;
      uVar3 = (pWVar6->features).relaxed_simd_enabled_;
      uVar4 = (pWVar6->features).custom_page_sizes_enabled_;
      errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._2_1_ = uVar4;
      errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._1_1_ = uVar3;
      errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_1_ = uVar2;
      errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_start = *(pointer *)&pWVar6->features;
      uVar19._0_1_ = (pWVar6->features).tail_call_enabled_;
      uVar19._1_1_ = (pWVar6->features).bulk_memory_enabled_;
      uVar19._2_1_ = (pWVar6->features).reference_types_enabled_;
      uVar19._3_1_ = (pWVar6->features).annotations_enabled_;
      uVar13 = (pWVar6->features).code_metadata_enabled_;
      uVar14 = (pWVar6->features).gc_enabled_;
      uVar16 = (pWVar6->features).memory64_enabled_;
      uVar18 = (pWVar6->features).multi_memory_enabled_;
      uVar17 = CONCAT11(uVar18,uVar16);
      uVar15 = CONCAT21(uVar17,uVar14);
      uVar19._4_4_ = CONCAT31(uVar15,uVar13);
      errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = (undefined4)uVar19;
      errors_1.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      errors_1.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      errors_1.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ = uVar19._4_4_;
      if (pWVar6->parse_binary_modules == true) {
        data = (pDVar24->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
        ReadBinaryIr("<text>",data,
                     (long)(pDVar24->data).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish - (long)data,
                     (ReadBinaryOptions *)&errors,&errors_1,this_00);
      }
      std::__cxx11::string::_M_assign
                ((string *)
                 ((long)uVar25._M_t.
                        super___uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>._M_t
                        .super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
                        super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x30));
      pEVar20 = errors_1.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
                super__Vector_impl_data._M_finish;
      sVar21 = (pDVar24->loc).filename._M_len;
      uVar10 = *(undefined4 *)((long)&(pDVar24->loc).filename._M_len + 4);
      uVar11 = *(undefined4 *)&(pDVar24->loc).filename._M_str;
      uVar12 = *(undefined4 *)((long)&(pDVar24->loc).filename._M_str + 4);
      uVar19 = *(undefined8 *)((long)&(pDVar24->loc).field_1 + 8);
      *(size_t *)
       ((long)uVar25._M_t.super___uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>.
              _M_t.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
              super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x20) =
           (pDVar24->loc).field_1.field_1.offset;
      *(undefined8 *)
       ((long)uVar25._M_t.super___uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>.
              _M_t.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
              super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x28) = uVar19;
      *(int *)&(this_00->loc).filename._M_len = (int)sVar21;
      *(undefined4 *)
       ((long)uVar25._M_t.super___uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>.
              _M_t.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
              super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x14) = uVar10;
      *(undefined4 *)
       ((long)uVar25._M_t.super___uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>.
              _M_t.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
              super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x18) = uVar11;
      *(undefined4 *)
       ((long)uVar25._M_t.super___uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>.
              _M_t.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
              super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x1c) = uVar12;
      for (pEVar27 = errors_1.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
                     super__Vector_impl_data._M_start; pEVar27 != pEVar20; pEVar27 = pEVar27 + 1) {
        if ((pEVar27->loc).field_1.field_1.offset == 0xffffffffffffffff) {
          Error(this,0x1e0779,(pEVar27->message)._M_dataplus._M_p);
        }
        else {
          Error(this,0x1e0794);
        }
      }
      local_68._M_head_impl = (ScriptModule *)0x0;
      plVar7 = *(long **)((long)m._M_t.
                                super___uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>
                                .super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x3d0);
      *(ScriptModule **)
       ((long)m._M_t.super___uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>._M_t.
              super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
              super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x3d0) = base._M_head_impl
      ;
      uVar25._M_t.super___uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>._M_t.
      super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
      super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl =
           m._M_t.super___uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>._M_t.
           super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
           super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl;
      if (plVar7 != (long *)0x0) {
        (**(code **)(*plVar7 + 8))();
        uVar25 = m;
      }
      m._M_t.super___uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>._M_t.
      super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
      super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl =
           (__uniq_ptr_data<wabt::Module,_std::default_delete<wabt::Module>,_true,_true>)
           (__uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>)0x0;
      pCVar5 = (out_command->_M_t).
               super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
               super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
               super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl;
      (out_command->_M_t).super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
      _M_t.super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
      super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl =
           (Command *)
           uVar25._M_t.super___uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>._M_t.
           super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
           super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl;
      if (pCVar5 != (Command *)0x0) {
        (*pCVar5->_vptr_Command[1])();
      }
      std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector(&errors_1);
      if ((__uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>)
          m._M_t.super___uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>._M_t.
          super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>)0x0) {
        (**(code **)(*(long *)m._M_t.
                              super___uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>
                              .super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 8))();
      }
      base._M_head_impl = (ScriptModule *)0x0;
    }
    else if (SVar1 == Text) {
      std::make_unique<wabt::ModuleCommand>();
      this_00 = (Module *)
                &((errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
                   super__Vector_impl_data._M_start)->loc).filename._M_str;
      pTVar23 = cast<wabt::TextScriptModule,wabt::ScriptModule>(base._M_head_impl);
      Module::operator=(this_00,&pTVar23->module);
      pEVar20 = errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
                super__Vector_impl_data._M_start;
      errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      pCVar5 = (out_command->_M_t).
               super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
               super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
               super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl;
      (out_command->_M_t).super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
      _M_t.super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
      super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl = (Command *)pEVar20;
      if ((pCVar5 != (Command *)0x0) &&
         ((*pCVar5->_vptr_Command[1])(),
         errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
         super__Vector_impl_data._M_start != (pointer)0x0)) {
        (**(code **)(*(long *)errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
    }
    else {
      this_00 = (Module *)0x0;
    }
    EVar26 = Ok;
    if (script != (Script *)0x0) {
      puVar8 = (script->commands).
               super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      puVar9 = (script->commands).
               super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this_00->name)._M_string_length != 0) {
        errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)(this_00->loc).filename._M_len;
        errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = *(undefined4 *)&(this_00->loc).filename._M_str;
        errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
        super__Vector_impl_data._M_finish._4_4_ =
             *(undefined4 *)((long)&(this_00->loc).filename._M_str + 4);
        errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = (this_00->loc).field_1.field_0.line;
        errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ =
             (this_00->loc).field_1.field_0.first_column;
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
        ::_M_emplace<std::__cxx11::string&,wabt::Binding>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                    *)&script->module_bindings,&this_00->name);
        base._M_head_impl = local_68._M_head_impl;
      }
      this->last_module_index_ = (Index)((ulong)((long)puVar8 - (long)puVar9) >> 3);
      EVar26 = Ok;
    }
  }
  if (base._M_head_impl != (ScriptModule *)0x0) {
    (*(base._M_head_impl)->_vptr_ScriptModule[1])(base._M_head_impl);
  }
  return (Result)EVar26;
}

Assistant:

Result WastParser::ParseModuleCommand(Script* script, CommandPtr* out_command) {
  WABT_TRACE(ParseModuleCommand);
  std::unique_ptr<ScriptModule> script_module;
  CHECK_RESULT(ParseScriptModule(&script_module));

  Module* module = nullptr;

  switch (script_module->type()) {
    case ScriptModuleType::Text: {
      auto command = std::make_unique<ModuleCommand>();
      module = &command->module;
      *module = std::move(cast<TextScriptModule>(script_module.get())->module);
      *out_command = std::move(command);
      break;
    }

    case ScriptModuleType::Binary: {
      auto command = std::make_unique<ScriptModuleCommand>();
      module = &command->module;
      auto* bsm = cast<BinaryScriptModule>(script_module.get());
      ReadBinaryOptions options;
#if WABT_TRACING
      auto log_stream = FileStream::CreateStdout();
      options.log_stream = log_stream.get();
#endif
      options.features = options_->features;
      Errors errors;
      const char* filename = "<text>";
      if (options_->parse_binary_modules) {
        ReadBinaryIr(filename, bsm->data.data(), bsm->data.size(), options,
                     &errors, module);
      }
      module->name = bsm->name;
      module->loc = bsm->loc;
      for (const auto& error : errors) {
        if (error.loc.offset == kInvalidOffset) {
          Error(bsm->loc, "error in binary module: %s", error.message.c_str());
        } else {
          Error(bsm->loc, "error in binary module: @0x%08" PRIzx ": %s",
                error.loc.offset, error.message.c_str());
        }
      }

      command->script_module = std::move(script_module);
      *out_command = std::move(command);
      break;
    }

    case ScriptModuleType::Quoted:
      auto command = std::make_unique<ModuleCommand>();
      module = &command->module;
      auto* qsm = cast<QuotedScriptModule>(script_module.get());
      Errors errors;
      const char* filename = "<text>";
      std::unique_ptr<Module> m;
      std::unique_ptr<WastLexer> lexer = WastLexer::CreateBufferLexer(
          filename, qsm->data.data(), qsm->data.size(), &errors);
      auto result = ParseWatModule(lexer.get(), &m, &errors, options_);
      for (const auto& error : errors) {
        if (error.loc.offset == kInvalidOffset) {
          Error(qsm->loc, "error in quoted module: %s", error.message.c_str());
        } else {
          Error(qsm->loc, "error in quoted module: @0x%08" PRIzx ": %s",
                error.loc.offset, error.message.c_str());
        }
      }
      if (Succeeded(result)) {
        *module = std::move(*m.get());
      }
      *out_command = std::move(command);
      break;
  }

  // script is nullptr when ParseModuleCommand is called from ParseModule.
  if (script) {
    Index command_index = script->commands.size();

    if (!module->name.empty()) {
      script->module_bindings.emplace(module->name,
                                      Binding(module->loc, command_index));
    }

    last_module_index_ = command_index;
  }

  return Result::Ok;
}